

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

void duckdb_brotli::BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command *commands,
               size_t *num_literals)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ushort uVar6;
  ushort uVar7;
  byte bVar8;
  uint16_t *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ushort uVar14;
  uint32_t uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  
  uVar11 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar3 = (params->dictionary).compound.total_size;
  sVar4 = params->stream_offset;
  puVar9 = &commands->dist_prefix_;
  lVar13 = 0;
  lVar25 = 0;
  uVar15 = (nodes->u).next;
  while (uVar15 != 0xffffffff) {
    uVar19 = nodes[lVar25 + (ulong)uVar15].length;
    uVar20 = nodes[lVar25 + (ulong)uVar15].dcode_insert_length;
    uVar16 = (ulong)(uVar20 & 0x7ffffff);
    uVar1 = nodes[lVar25 + (ulong)uVar15].u.next;
    bVar26 = lVar13 == 0;
    lVar13 = lVar13 + -1;
    uVar24 = uVar16;
    if (bVar26) {
      uVar24 = *last_insert_len + uVar16;
      *last_insert_len = 0;
    }
    uVar12 = uVar19 & 0x1ffffff;
    uVar2 = nodes[lVar25 + (ulong)uVar15].distance;
    iVar17 = uVar12 - (uVar19 >> 0x19);
    uVar18 = iVar17 + 9;
    uVar23 = block_start + sVar4 + lVar25 + uVar16;
    if (uVar11 <= uVar23) {
      uVar23 = uVar11;
    }
    uVar5 = (uVar20 >> 0x1b) - 1;
    if (uVar20 < 0x8000000) {
      uVar5 = uVar2 + 0xf;
    }
    ((Command *)(puVar9 + -7))->insert_len_ = (uint32_t)uVar24;
    *(uint *)(puVar9 + -5) = (uVar18 - uVar19) * 0x2000000 | uVar12;
    uVar10 = (ulong)(params->dist).num_direct_distance_codes;
    uVar21 = uVar10 + 0x10;
    if (uVar5 < uVar21) {
      uVar15 = 0;
      uVar14 = (ushort)uVar5;
    }
    else {
      uVar15 = (params->dist).distance_postfix_bits;
      bVar8 = (byte)uVar15;
      uVar10 = ((uVar5 - uVar10) + (4L << (bVar8 & 0x3f))) - 0x10;
      uVar19 = 0x1f;
      if ((uint)uVar10 != 0) {
        for (; (uint)uVar10 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar19 = (uVar19 ^ 0xffffffe0) + 0x1f;
      bVar26 = (uVar10 >> ((ulong)uVar19 & 0x3f) & 1) != 0;
      iVar22 = uVar19 - uVar15;
      uVar14 = (short)((uint)bVar26 + iVar22 * 2 + 0xfffe << (bVar8 & 0x3f)) +
               (short)uVar21 + (~(ushort)(-1 << (bVar8 & 0x1f)) & (ushort)uVar10) |
               (short)iVar22 * 0x400;
      uVar15 = (uint32_t)(uVar10 - ((ulong)bVar26 + 2 << ((byte)uVar19 & 0x3f)) >> (bVar8 & 0x3f));
    }
    *puVar9 = uVar14;
    *(uint32_t *)(puVar9 + -3) = uVar15;
    if (uVar24 < 6) {
      uVar21 = uVar24 & 0xffffffff;
    }
    else if (uVar24 < 0x82) {
      uVar19 = 0x1f;
      uVar20 = (uint)(uVar24 - 2);
      if (uVar20 != 0) {
        for (; uVar20 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar21 = (ulong)((int)(uVar24 - 2 >> ((char)(uVar19 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar19 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar24 < 0x842) {
      uVar20 = (uint32_t)uVar24 - 0x42;
      uVar19 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar21 = (ulong)((uVar19 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar21 = 0x15;
      if (0x1841 < uVar24) {
        uVar21 = (ulong)(ushort)(0x17 - (uVar24 < 0x5842));
      }
    }
    if (uVar18 < 10) {
      uVar19 = iVar17 + 7;
    }
    else if (uVar18 < 0x86) {
      uVar20 = iVar17 + 3;
      uVar19 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar19 = (int)((ulong)(long)(int)uVar20 >> ((char)(uVar19 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar19 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar19 = 0x17;
      if (uVar18 < 0x846) {
        uVar19 = 0x1f;
        if (iVar17 - 0x3dU != 0) {
          for (; iVar17 - 0x3dU >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        uVar19 = (uVar19 ^ 0xffe0) + 0x2c;
      }
    }
    uVar6 = (ushort)uVar19;
    uVar7 = (uVar6 & 7) + ((ushort)uVar21 & 7) * 8;
    if ((((uVar14 & 0x3ff) == 0) && ((ushort)uVar21 < 8)) && (uVar6 < 0x10)) {
      if (7 < uVar6) {
        uVar7 = uVar7 + 0x40;
      }
    }
    else {
      iVar17 = (int)((uVar21 & 0xffff) >> 3) * 3 + ((uVar19 & 0xffff) >> 3);
      uVar7 = uVar7 + ((ushort)(0x520d40 >> ((char)iVar17 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar17 * 0x40 + 0x40;
    }
    puVar9[-1] = uVar7;
    if (((ulong)uVar2 <= uVar23 + sVar3) && (uVar5 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = uVar2;
    }
    *num_literals = *num_literals + uVar24;
    lVar25 = lVar25 + uVar16 + (ulong)uVar12;
    puVar9 = puVar9 + 8;
    uVar15 = uVar1;
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar25);
  return;
}

Assistant:

void duckdb_brotli::BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = params->dictionary.compound.total_size;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}